

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void __thiscall
cimg_library::CImgDisplay::_resize<unsigned_char>
          (CImgDisplay *this,uchar pixel_type,uint ndimx,uint ndimy,bool force_redraw)

{
  Display *pDVar1;
  undefined8 uVar2;
  X11_info *pXVar3;
  uchar *ptrd;
  XImage *pXVar4;
  undefined7 in_register_00000081;
  
  pXVar3 = cimg::X11_attr();
  pDVar1 = pXVar3->display;
  ptrd = (uchar *)malloc((ulong)(ndimy * ndimx));
  if ((int)CONCAT71(in_register_00000081,force_redraw) == 0) {
    memset(ptrd,0,(ulong)ndimy * (ulong)ndimx);
  }
  else {
    _render_resize<unsigned_char,unsigned_char>
              ((uchar *)this->_data,this->_width,this->_height,ptrd,ndimx,ndimy);
  }
  this->_data = ptrd;
  (*(this->_image->f).destroy_image)(this->_image);
  uVar2 = *(undefined8 *)(*(long *)(pDVar1 + 0xe8) + 0x40 + (long)*(int *)(pDVar1 + 0xe0) * 0x80);
  pXVar3 = cimg::X11_attr();
  pXVar4 = (XImage *)XCreateImage(pDVar1,uVar2,pXVar3->nb_bits,2,0,this->_data,ndimx,ndimy,8,0);
  this->_image = pXVar4;
  return;
}

Assistant:

void _resize(T pixel_type, const unsigned int ndimx, const unsigned int ndimy, const bool force_redraw) {
      Display *const dpy = cimg::X11_attr().display;
      cimg::unused(pixel_type);

#ifdef cimg_use_xshm
      if (_shminfo) {
        XShmSegmentInfo *const nshminfo = new XShmSegmentInfo;
        XImage *const nimage = XShmCreateImage(dpy,DefaultVisual(dpy,DefaultScreen(dpy)),
                                               cimg::X11_attr().nb_bits,ZPixmap,0,nshminfo,ndimx,ndimy);
        if (!nimage) { delete nshminfo; return; }
        else {
          nshminfo->shmid = shmget(IPC_PRIVATE,ndimx*ndimy*sizeof(T),IPC_CREAT | 0777);
          if (nshminfo->shmid==-1) { XDestroyImage(nimage); delete nshminfo; return; }
          else {
            nshminfo->shmaddr = nimage->data = (char*)shmat(nshminfo->shmid,0,0);
            if (nshminfo->shmaddr==(char*)-1) { shmctl(nshminfo->shmid,IPC_RMID,0); XDestroyImage(nimage); delete nshminfo; return; }
            else {
              nshminfo->readOnly = False;
              cimg::X11_attr().is_shm_enabled = true;
              XErrorHandler oldXErrorHandler = XSetErrorHandler(_assign_xshm);
              XShmAttach(dpy,nshminfo);
              XFlush(dpy);
              XSetErrorHandler(oldXErrorHandler);
              if (!cimg::X11_attr().is_shm_enabled) {
                shmdt(nshminfo->shmaddr);
                shmctl(nshminfo->shmid,IPC_RMID,0);
                XDestroyImage(nimage);
                delete nshminfo;
                return;
              } else {
                T *const ndata = (T*)nimage->data;
                if (force_redraw) _render_resize((T*)_data,_width,_height,ndata,ndimx,ndimy);
                else std::memset(ndata,0,sizeof(T)*ndimx*ndimy);
                XShmDetach(dpy,_shminfo);
                XDestroyImage(_image);
                shmdt(_shminfo->shmaddr);
                shmctl(_shminfo->shmid,IPC_RMID,0);
                delete _shminfo;
                _shminfo = nshminfo;
                _image = nimage;
                _data = (void*)ndata;
              }
            }
          }
        }
      } else
#endif
        {
          T *ndata = (T*)std::malloc(ndimx*ndimy*sizeof(T));
          if (force_redraw) _render_resize((T*)_data,_width,_height,ndata,ndimx,ndimy);
          else std::memset(ndata,0,sizeof(T)*ndimx*ndimy);
          _data = (void*)ndata;
          XDestroyImage(_image);
          _image = XCreateImage(dpy,DefaultVisual(dpy,DefaultScreen(dpy)),
                                cimg::X11_attr().nb_bits,ZPixmap,0,(char*)_data,ndimx,ndimy,8,0);
        }
    }